

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O0

bool __thiscall
AutoArgParse::FlagStore::tryParseArg
          (FlagStore *this,ArgIter *first,ArgIter *last,Policy *foundArgPolicy)

{
  bool bVar1;
  reference this_00;
  pointer pAVar2;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  iterator __end1;
  iterator __begin1;
  ArgVector *__range1;
  Policy *foundArgPolicy_local;
  ArgIter *last_local;
  ArgIter *first_local;
  FlagStore *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ::begin(&this->args);
  argPtr = (unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *)
           std::
           vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ::end(&this->args);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
                                *)&argPtr);
    if (!bVar1) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
              ::operator*(&__end1);
    pAVar2 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
             operator->(this_00);
    bVar1 = ParseToken::parsed(&pAVar2->super_ParseToken);
    if (!bVar1) {
      pAVar2 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
               operator->(this_00);
      (*(pAVar2->super_ParseToken)._vptr_ParseToken[2])(pAVar2,first,last);
      pAVar2 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
               operator->(this_00);
      bVar1 = ParseToken::parsed(&pAVar2->super_ParseToken);
      if (bVar1) {
        pAVar2 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
                 ::operator->(this_00);
        *foundArgPolicy = (pAVar2->super_ParseToken).policy;
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

AUTOARGPARSE_INLINE bool FlagStore::tryParseArg(ArgIter& first, ArgIter& last,
                                                Policy& foundArgPolicy) {
    for (auto& argPtr : args) {
        if (argPtr->parsed()) {
            continue;
        }
        argPtr->parse(first, last);
        if (argPtr->parsed()) {
            foundArgPolicy = argPtr->policy;
            return true;
        }
    }
    return false;
}